

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined4 uVar2;
  secp256k1_callback sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  lVar1 = 0;
  do {
    if (scratch->magic[lVar1] != "scratch"[lVar1]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  if (scratch->alloc_size == 0) {
    free(scratch);
    return;
  }
  secp256k1_scratch_destroy_cold_1();
  auVar4._0_4_ = (int)(short)scratch;
  auVar4._4_4_ = (int)(short)((ulong)scratch >> 0x10);
  auVar4._8_4_ = (int)(short)((ulong)scratch >> 0x20);
  auVar4._12_4_ = (int)(short)((ulong)scratch >> 0x30);
  auVar5._0_4_ = (int)(short)extraout_RDX;
  auVar5._4_4_ = (int)(short)((ulong)extraout_RDX >> 0x10);
  auVar5._8_4_ = (int)(short)((ulong)extraout_RDX >> 0x20);
  auVar5._12_4_ = (int)(short)((ulong)extraout_RDX >> 0x30);
  sVar3 = (secp256k1_callback)packssdw(auVar4,auVar5);
  *error_callback = sVar3;
  auVar4 = ZEXT416((uint)((long)extraout_RDX >> 0x3f));
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar2 = auVar4._0_4_;
  *(undefined4 *)&error_callback[1].fn = uVar2;
  *(undefined4 *)((long)&error_callback[1].fn + 4) = uVar2;
  *(undefined4 *)&error_callback[1].data = uVar2;
  *(undefined4 *)((long)&error_callback[1].data + 4) = uVar2;
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}